

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

uint __thiscall FirewirePort::GetBusGeneration(FirewirePort *this)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  
  uVar1 = (this->super_BasePort).FwBusGeneration;
  uVar2 = raw1394_get_generation(this->handle);
  if (uVar1 != uVar2) {
    poVar3 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"FirewirePort::GetBusGeneration mismatch: ",0x29);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    raw1394_get_generation(this->handle);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return (this->super_BasePort).FwBusGeneration;
}

Assistant:

unsigned int FirewirePort::GetBusGeneration(void) const
{
    if (FwBusGeneration != raw1394_get_generation(handle))
        outStr << "FirewirePort::GetBusGeneration mismatch: " << FwBusGeneration
               << ", " << raw1394_get_generation(handle) << std::endl;
    return FwBusGeneration;
}